

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O3

PropertiesIterator * __thiscall
Rml::ElementStyle::Iterate(PropertiesIterator *__return_storage_ptr__,ElementStyle *this)

{
  uint8_t *puVar1;
  element_type *this_00;
  PropertyIt it_definition_end;
  PropertyMap *pPVar2;
  uint8_t *puVar3;
  const_iterator it_style;
  PropertyIt it_definition;
  PropertyIt it_style_end;
  
  pPVar2 = PropertyDictionary::GetProperties(&this->inline_properties);
  it_style = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::cbegin(pPVar2);
  puVar1 = pPVar2->mInfo;
  this_00 = (this->definition).
            super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (element_type *)0x0) {
    it_definition = (PropertyIt)ZEXT816(0);
    puVar3 = (uint8_t *)0x0;
  }
  else {
    pPVar2 = PropertyDictionary::GetProperties(&this_00->properties);
    it_definition =
         robin_hood::detail::
         Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
         ::cbegin(pPVar2);
    puVar3 = pPVar2->mInfo;
  }
  it_definition_end.mInfo = (uint8_t *)0x0;
  it_definition_end.mKeyVals = (NodePtr)puVar3;
  it_style_end.mInfo = (uint8_t *)0x0;
  it_style_end.mKeyVals = (NodePtr)puVar1;
  PropertiesIterator::PropertiesIterator
            (__return_storage_ptr__,it_style,it_style_end,it_definition,it_definition_end);
  return __return_storage_ptr__;
}

Assistant:

PropertiesIterator ElementStyle::Iterate() const
{
	// Note: Value initialized iterators are only guaranteed to compare equal in C++14, and only for iterators
	// satisfying the ForwardIterator requirements.
#ifdef _MSC_VER
	// Null forward iterator supported since VS 2015
	static_assert(_MSC_VER >= 1900, "Visual Studio 2015 or higher required, see comment.");
#else
	static_assert(__cplusplus >= 201402L, "C++14 or higher required, see comment.");
#endif

	const PropertyMap& property_map = inline_properties.GetProperties();
	auto it_style_begin = property_map.begin();
	auto it_style_end = property_map.end();

	PropertyMap::const_iterator it_definition{}, it_definition_end{};
	if (definition)
	{
		const PropertyMap& definition_properties = definition->GetProperties().GetProperties();
		it_definition = definition_properties.begin();
		it_definition_end = definition_properties.end();
	}
	return PropertiesIterator(it_style_begin, it_style_end, it_definition, it_definition_end);
}